

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O0

void __thiscall
amrex::StateDescriptor::setComponent
          (StateDescriptor *this,int comp,string *nm,BCRec *bcr,BndryFunc *func,InterpBase *a_interp
          ,int max_map_start_comp_,int min_map_end_comp_)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  BCRec *pBVar1;
  InterpBase **ppIVar2;
  int *piVar3;
  undefined8 *in_RCX;
  string *in_RDX;
  int in_ESI;
  undefined8 *in_R8;
  InterpBase *in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_ffffffffffffff98;
  int iVar4;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  Vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  (**(code **)*in_R8)();
  std::
  unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  ::reset((unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
           *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (pointer)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  this_00 = Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__cxx11::string::operator=((string *)this_00,in_RDX);
  pBVar1 = Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator[]
                     ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *(undefined8 *)pBVar1->bc = *in_RCX;
  *(undefined8 *)(pBVar1->bc + 2) = in_RCX[1];
  *(undefined8 *)(pBVar1->bc + 4) = in_RCX[2];
  ppIVar2 = Vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>::operator[]
                      ((Vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_> *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *ppIVar2 = in_R9;
  piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *piVar3 = 0;
  piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *piVar3 = 0;
  if ((in_stack_00000008 < 0) || (in_stack_00000010 < 0)) {
    iVar4 = in_ESI;
    piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        CONCAT44(in_stack_ffffffffffffff9c,in_ESI));
    *piVar3 = iVar4;
    piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        CONCAT44(in_ESI,iVar4));
    *piVar3 = in_ESI;
  }
  else {
    piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_00000008),
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    *piVar3 = in_stack_00000008;
    piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_00000010,in_stack_00000008),
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    *piVar3 = in_stack_00000010;
  }
  return;
}

Assistant:

void
StateDescriptor::setComponent (int                               comp,
                               const std::string&                nm,
                               const BCRec&                      bcr,
                               const StateDescriptor::BndryFunc& func,
                               InterpBase*                       a_interp,
                               int                               max_map_start_comp_,
                               int                               min_map_end_comp_)
{
    bc_func[comp].reset(func.clone());

    names[comp]       = nm;
    bc[comp]          = bcr;
    mapper_comp[comp] = a_interp;
    m_primary[comp]    = false;
    m_groupsize[comp] = 0;

    if (max_map_start_comp_>=0 && min_map_end_comp_>=0)
    {
        BL_ASSERT(comp >= max_map_start_comp_ &&
                  comp <= min_map_end_comp_   &&
                  min_map_end_comp_ < ncomp);
        max_map_start_comp[comp] = max_map_start_comp_;
        min_map_end_comp[comp]   = min_map_end_comp_;
    }
    else
    {
        max_map_start_comp[comp] = comp;
        min_map_end_comp[comp]   = comp;
    }
}